

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_algor.cc
# Opt level: O0

void X509_ALGOR_free(X509_ALGOR *a)

{
  X509_ALGOR *a_local;
  
  ASN1_item_free((ASN1_VALUE *)a,(ASN1_ITEM *)&X509_ALGOR_it);
  return;
}

Assistant:

int X509_ALGOR_set0(X509_ALGOR *alg, ASN1_OBJECT *aobj, int ptype, void *pval) {
  if (!alg) {
    return 0;
  }
  if (ptype != V_ASN1_UNDEF) {
    if (alg->parameter == NULL) {
      alg->parameter = ASN1_TYPE_new();
    }
    if (alg->parameter == NULL) {
      return 0;
    }
  }
  if (alg) {
    ASN1_OBJECT_free(alg->algorithm);
    alg->algorithm = aobj;
  }
  if (ptype == 0) {
    return 1;
  }
  if (ptype == V_ASN1_UNDEF) {
    if (alg->parameter) {
      ASN1_TYPE_free(alg->parameter);
      alg->parameter = NULL;
    }
  } else {
    ASN1_TYPE_set(alg->parameter, ptype, pval);
  }
  return 1;
}